

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O3

void __thiscall CVmObjStringBuffer::ensure_space(CVmObjStringBuffer *this,int32_t len)

{
  vm_strbuf_ext *pvVar1;
  
  pvVar1 = (vm_strbuf_ext *)(this->super_CVmObject).ext_;
  if (pvVar1->alo < len) {
    pvVar1 = vm_strbuf_ext::expand_ext(this,pvVar1,len);
    (this->super_CVmObject).ext_ = (char *)pvVar1;
  }
  return;
}

Assistant:

void CVmObjStringBuffer::ensure_space(VMG_ int32_t len)
{
    /* if the desired new length exceeds the limit, it's an error */
    if (len > STRBUF_MAX_LEN)
        err_throw(VMERR_STR_TOO_LONG);

    /* if the desired new length exceeds the current allocation, expand it */
    if (len > (int32_t)get_ext()->alo)
    {
        ext_ = (char *)vm_strbuf_ext::expand_ext(
            vmg_ this, get_ext(), len);
    }
}